

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O0

void test_web_init(Am_Slot *slot,Am_Web_Init *init)

{
  Am_Object_Advanced AVar1;
  Am_Value *pAVar2;
  Am_Object_Advanced local_58;
  Am_Object_Advanced local_50;
  Am_Object_Advanced local_48;
  Am_Object_Advanced local_40;
  int local_38;
  int size;
  int local_24;
  int value;
  Am_Object_Advanced obj;
  Am_Web_Init *init_local;
  Am_Slot *slot_local;
  
  obj.super_Am_Object.data = (Am_Object)(Am_Object)init;
  Am_Slot::Get_Owner();
  pAVar2 = (Am_Value *)Am_Slot::Get();
  local_24 = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe0,0x274c);
  local_38 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set((ushort)&stack0xffffffffffffffe0,0x272e,(ulong)(uint)(local_24 + local_38));
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_40,(Am_Object_Advanced *)&stack0xffffffffffffffe0);
  Am_Web_Init::Note_Output(AVar1,(ushort)&local_40);
  Am_Object_Advanced::~Am_Object_Advanced(&local_40);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_48,(Am_Object_Advanced *)&stack0xffffffffffffffe0);
  Am_Web_Init::Note_Input(AVar1,(ushort)&local_48);
  Am_Object_Advanced::~Am_Object_Advanced(&local_48);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_50,(Am_Object_Advanced *)&stack0xffffffffffffffe0);
  Am_Web_Init::Note_Input(AVar1,(ushort)&local_50);
  Am_Object_Advanced::~Am_Object_Advanced(&local_50);
  AVar1 = obj;
  Am_Object_Advanced::Am_Object_Advanced(&local_58,(Am_Object_Advanced *)&stack0xffffffffffffffe0);
  Am_Web_Init::Note_Input(AVar1,(ushort)&local_58);
  Am_Object_Advanced::~Am_Object_Advanced(&local_58);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
test_web_init(const Am_Slot &slot, Am_Web_Init &init)
{
  Am_Object_Advanced obj = slot.Get_Owner();
  int value = slot.Get();
  int size = obj.Get(SHADOW);
  obj.Set(WIDTH, value + size);
  init.Note_Output(obj, WIDTH);
  init.Note_Input(obj, LEFT);
  init.Note_Input(obj, WIDTH);
  init.Note_Input(obj, SHADOW);
}